

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void os_set_text_color(os_color_t fg,os_color_t bg)

{
  osgen_txtwin_t *win;
  char buf [4];
  char local_1c;
  char local_1b;
  char local_1a;
  
  win = S_default_win;
  if (S_default_win != (osgen_txtwin_t *)0x0 && os_f_plain == 0) {
    local_1c = '\x02';
    local_1b = osgen_xlat_color_t(fg);
    local_1a = osgen_xlat_color_t(bg);
    ossaddsb(win,&local_1c,3,1);
  }
  return;
}

Assistant:

void os_set_text_color(os_color_t fg, os_color_t bg)
{
    char buf[4];

    /* if we're in plain mode, ignore it */
    if (os_f_plain || S_default_win == 0)
        return;

    /* add the color sequence to the default window's scrollback buffer */
    buf[0] = OSGEN_COLOR;
    buf[1] = osgen_xlat_color_t(fg);
    buf[2] = osgen_xlat_color_t(bg);
    ossaddsb(S_default_win, buf, 3, TRUE);
}